

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall soul::AST::StructDeclaration::~StructDeclaration(StructDeclaration *this)

{
  ~StructDeclaration(this);
  operator_delete(this,0x2e0);
  return;
}

Assistant:

~StructDeclaration() override
        {
            if (structure != nullptr)
                structure->backlinkToASTObject = nullptr;
        }